

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffdstr(fitsfile *fptr,char *string,int *status)

{
  FITSfile *pFVar1;
  undefined1 auVar2 [16];
  int iVar3;
  size_t sVar4;
  char value [71];
  char valstring [71];
  char comm [73];
  char card [81];
  char nextcomm [73];
  undefined8 uStack_1e0;
  char local_1d8 [80];
  char local_188 [80];
  char local_138 [96];
  char local_d8 [96];
  char local_78 [80];
  
  if (0 < *status) {
    return *status;
  }
  uStack_1e0 = 0x1dafac;
  iVar3 = ffgstr(fptr,string,local_d8,status);
  if (iVar3 < 1) {
    pFVar1 = fptr->Fptr;
    auVar2 = SEXT816(pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) *
             SEXT816(0x6666666666666667);
    iVar3 = (int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f);
    uStack_1e0 = 0x1db020;
    ffdrec(fptr,iVar3,status);
    uStack_1e0 = 0x1db03d;
    ffpsvc(local_d8,local_188,local_138,status);
    if (0 < *status) {
      return *status;
    }
    uStack_1e0 = 0x1db059;
    ffpmrk();
    uStack_1e0 = 0x1db069;
    ffc2s(local_188,local_1d8,status);
    if (*status == 0xcc) {
      uStack_1e0 = 0x1db076;
      ffcmrk();
      *status = 0;
    }
    else {
      uStack_1e0 = 0x1db08c;
      sVar4 = strlen(local_1d8);
      if ((int)sVar4 != 0) {
        do {
          if (local_1d8[(long)(int)sVar4 + -1] != '&') break;
          uStack_1e0 = 0x1db0bb;
          ffgcnt(fptr,local_1d8,local_78,status);
          if (local_1d8[0] == '\0') {
            sVar4 = 0;
          }
          else {
            uStack_1e0 = 0x1db0cf;
            ffdrec(fptr,iVar3,status);
            uStack_1e0 = 0x1db0d7;
            sVar4 = strlen(local_1d8);
          }
        } while ((int)sVar4 != 0);
      }
    }
  }
  else {
    uStack_1e0 = 0x1dafd1;
    snprintf(local_138,0x51,"Could not find the %s keyword to delete (ffdkey)",string);
    uStack_1e0 = 0x1dafd9;
    ffpmsg(local_138);
  }
  return *status;
}

Assistant:

int ffdstr(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *string,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword containing the input string
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char card[FLEN_CARD], message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgstr(fptr, string, card, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                string);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    /* check for string value which may be continued over multiple keywords */
    ffpsvc(card, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}